

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.c
# Opt level: O1

int split(char *string,char **fields,int nfields,char *sep)

{
  char cVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  char cVar6;
  char *pcVar7;
  char *pcVar8;
  
  cVar1 = *sep;
  cVar6 = cVar1;
  if (cVar1 == '\0') {
    for (; (*string == ' ' || (*string == '\t')); string = string + 1) {
    }
    sep = " \t";
    cVar6 = ' ';
  }
  if (*string == '\0') {
    nfields = 0;
  }
  else {
    cVar2 = sep[1];
    if (cVar2 != '\0') {
      iVar4 = nfields;
      if (sep[2] != '\0') {
        iVar4 = 0;
        do {
          if (iVar4 < nfields) {
            *fields = string;
            fields = fields + 1;
          }
          iVar4 = iVar4 + 1;
          do {
            pcVar7 = string;
            if (*pcVar7 == '\0') {
              return iVar4;
            }
            string = pcVar7 + 1;
            pcVar8 = sep;
            do {
              cVar1 = *pcVar8;
              if (cVar1 == '\0') break;
              pcVar8 = pcVar8 + 1;
            } while (cVar1 != *pcVar7);
          } while (cVar1 == '\0');
          pcVar8 = string;
          if (iVar4 < nfields) {
            *pcVar7 = '\0';
          }
          do {
            string = pcVar8;
            pcVar7 = sep;
            do {
              cVar1 = *pcVar7;
              if (cVar1 == '\0') break;
              pcVar7 = pcVar7 + 1;
            } while (cVar1 != *string);
            pcVar8 = string + 1;
          } while (cVar1 != '\0');
        } while( true );
      }
      while( true ) {
        *fields = string;
        fields = fields + 1;
        iVar5 = iVar4 + -1;
        pcVar7 = string;
        while ((cVar3 = *pcVar7, cVar3 != cVar2 && (cVar6 != cVar3))) {
          pcVar7 = pcVar7 + 1;
          if (cVar3 == '\0') {
            if ((cVar1 == '\0') && (*string == '\0')) {
              iVar5 = iVar4;
            }
            goto LAB_00104b45;
          }
        }
        if (iVar5 == 0) break;
        *pcVar7 = '\0';
        do {
          pcVar8 = pcVar7 + 1;
          pcVar7 = pcVar7 + 1;
          string = pcVar7;
          iVar4 = iVar5;
        } while (*pcVar8 == cVar2 || cVar6 == *pcVar8);
      }
      iVar4 = nfields;
      if (cVar3 != '\0') {
        pcVar8 = pcVar7 + 1;
        do {
          pcVar8 = pcVar8 + -1;
          do {
            pcVar7 = pcVar8 + 1;
            pcVar8 = pcVar8 + 1;
          } while (*pcVar7 == cVar2 || cVar6 == *pcVar7);
          do {
            pcVar7 = pcVar8;
            cVar3 = *pcVar7;
            pcVar8 = pcVar7 + 1;
            if ((cVar3 == cVar2) || (cVar3 == '\0')) break;
          } while (cVar6 != cVar3);
          iVar4 = iVar4 + 1;
        } while (cVar3 != '\0');
      }
      if (cVar1 != '\0') {
        return iVar4;
      }
      pcVar7 = pcVar7 + 1;
      do {
        pcVar8 = pcVar7 + -2;
        pcVar7 = pcVar7 + -1;
      } while (*pcVar8 == cVar2 || cVar6 == *pcVar8);
      if (*pcVar7 == '\0') {
        return iVar4;
      }
      if (iVar4 == nfields + 1) {
        *pcVar7 = '\0';
      }
      return iVar4 + -1;
    }
    *fields = string;
    iVar5 = nfields;
    while (iVar5 = iVar5 + -1, iVar5 != 0) {
      fields = fields + 1;
      pcVar7 = string;
      while( true ) {
        string = pcVar7 + 1;
        cVar1 = *pcVar7;
        if (cVar6 == cVar1) break;
        pcVar7 = string;
        if (cVar1 == '\0') {
LAB_00104b45:
          return nfields - iVar5;
        }
      }
      *pcVar7 = '\0';
      *fields = string;
    }
    do {
      while( true ) {
        cVar1 = *string;
        if (cVar6 != cVar1) break;
        nfields = nfields + 1;
        string = string + 1;
      }
      string = string + 1;
    } while (cVar1 != '\0');
  }
  return nfields;
}

Assistant:

int				/* number of fields, including overflow */
split(string, fields, nfields, sep)
char *string;
char *fields[];			/* list is not NULL-terminated */
int nfields;			/* number of entries available in fields[] */
char *sep;			/* "" white, "c" single char, "ab" [ab]+ */
{
	register char *p = string;
	register char c;			/* latest character */
	register char sepc = sep[0];
	register char sepc2;
	register int fn;
	register char **fp = fields;
	register char *sepp;
	register int trimtrail;

	/* white space */
	if (sepc == '\0') {
		while ((c = *p++) == ' ' || c == '\t')
			continue;
		p--;
		trimtrail = 1;
		sep = " \t";	/* note, code below knows this is 2 long */
		sepc = ' ';
	} else
		trimtrail = 0;
	sepc2 = sep[1];		/* now we can safely pick this up */

	/* catch empties */
	if (*p == '\0')
		return(0);

	/* single separator */
	if (sepc2 == '\0') {
		fn = nfields;
		for (;;) {
			*fp++ = p;
			fn--;
			if (fn == 0)
				break;
			while ((c = *p++) != sepc)
				if (c == '\0')
					return(nfields - fn);
			*(p-1) = '\0';
		}
		/* we have overflowed the fields vector -- just count them */
		fn = nfields;
		for (;;) {
			while ((c = *p++) != sepc)
				if (c == '\0')
					return(fn);
			fn++;
		}
		/* not reached */
	}

	/* two separators */
	if (sep[2] == '\0') {
		fn = nfields;
		for (;;) {
			*fp++ = p;
			fn--;
			while ((c = *p++) != sepc && c != sepc2)
				if (c == '\0') {
					if (trimtrail && **(fp-1) == '\0')
						fn++;
					return(nfields - fn);
				}
			if (fn == 0)
				break;
			*(p-1) = '\0';
			while ((c = *p++) == sepc || c == sepc2)
				continue;
			p--;
		}
		/* we have overflowed the fields vector -- just count them */
		fn = nfields;
		while (c != '\0') {
			while ((c = *p++) == sepc || c == sepc2)
				continue;
			p--;
			fn++;
			while ((c = *p++) != '\0' && c != sepc && c != sepc2)
				continue;
		}
		/* might have to trim trailing white space */
		if (trimtrail) {
			p--;
			while ((c = *--p) == sepc || c == sepc2)
				continue;
			p++;
			if (*p != '\0') {
				if (fn == nfields+1)
					*p = '\0';
				fn--;
			}
		}
		return(fn);
	}

	/* n separators */
	fn = 0;
	for (;;) {
		if (fn < nfields)
			*fp++ = p;
		fn++;
		for (;;) {
			c = *p++;
			if (c == '\0')
				return(fn);
			sepp = sep;
			while ((sepc = *sepp++) != '\0' && sepc != c)
				continue;
			if (sepc != '\0')	/* it was a separator */
				break;
		}
		if (fn < nfields)
			*(p-1) = '\0';
		for (;;) {
			c = *p++;
			sepp = sep;
			while ((sepc = *sepp++) != '\0' && sepc != c)
				continue;
			if (sepc == '\0')	/* it wasn't a separator */
				break;
		}
		p--;
	}

	/* not reached */
}